

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_SetAllocatedOneofMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_SetAllocatedOneofMessageTest_Test *this)

{
  Descriptor *this_00;
  FieldDescriptor *pFVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Reflection *this_01;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_5;
  internal iVar4;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  Metadata MVar5;
  Message *released;
  TestOneof2 to_message;
  TestOneof2 from_message2;
  TestOneof2 from_message1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_128;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  AssertHelper local_110;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Message *local_e8;
  TestOneof2 local_e0;
  TestOneof2 local_a0;
  TestOneof2 local_60;
  
  proto2_unittest::TestOneof2::TestOneof2(&local_60,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_a0,(Arena *)0x0);
  proto2_unittest::TestOneof2::TestOneof2(&local_e0,(Arena *)0x0);
  MVar5 = proto2_unittest::TestOneof2::GetMetadata
                    ((TestOneof2 *)proto2_unittest::_TestOneof2_default_instance_);
  this_00 = MVar5.descriptor;
  MVar5 = proto2_unittest::TestOneof2::GetMetadata
                    ((TestOneof2 *)proto2_unittest::_TestOneof2_default_instance_);
  this_01 = MVar5.reflection;
  name._M_str = "foo_lazy_message";
  name._M_len = 0x10;
  pFVar1 = Descriptor::FindFieldByName(this_00,name);
  local_e8 = Reflection::ReleaseMessage
                       (this_01,&local_e0.super_Message,pFVar1,(MessageFactory *)0x0);
  iVar4 = (internal)(local_e8 == (Message *)0x0);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_120._M_head_impl._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)&local_120,(AssertionResult *)"released == nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4a2,(char *)CONCAT71(local_108._1_7_,local_108[0]));
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._1_7_,local_108[0]) != &local_f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._1_7_,local_108[0]),local_f8._M_allocated_capacity + 1);
    }
    if (local_128._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_128._M_head_impl + 8))();
    }
    if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_118,local_118);
    }
  }
  name_00._M_str = "foo_message";
  name_00._M_len = 0xb;
  pFVar1 = Descriptor::FindFieldByName(this_00,name_00);
  local_e8 = Reflection::ReleaseMessage
                       (this_01,&local_e0.super_Message,pFVar1,(MessageFactory *)0x0);
  local_120._M_head_impl._0_1_ = (internal)(local_e8 == (Message *)0x0);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_120._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)&local_120,(AssertionResult *)"released == nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4a5,(char *)CONCAT71(local_108._1_7_,local_108[0]));
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._1_7_,local_108[0]) != &local_f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._1_7_,local_108[0]),local_f8._M_allocated_capacity + 1);
    }
    if (local_128._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_128._M_head_impl + 8))();
    }
    if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_118,local_118);
    }
  }
  TestUtil::ReflectionTester::SetOneofViaReflection(&local_60.super_Message);
  TestUtil::ReflectionTester::ExpectOneofSetViaReflection(&local_60.super_Message);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            (&local_60.super_Message,&local_e0.super_Message);
  name_01._M_str = "foo_lazy_message";
  name_01._M_len = 0x10;
  pFVar1 = Descriptor::FindFieldByName(this_00,name_01);
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Reflection::GetMessage(this_01,&local_e0.super_Message,pFVar1,(MessageFactory *)0x0);
  name_02._M_str = "foo_lazy_message";
  name_02._M_len = 0x10;
  pFVar1 = Descriptor::FindFieldByName(this_00,name_02);
  local_e8 = Reflection::ReleaseMessage
                       (this_01,&local_e0.super_Message,pFVar1,(MessageFactory *)0x0);
  local_120._M_head_impl._0_1_ = (internal)(local_e8 != (Message *)0x0);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_e8 == (Message *)0x0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)&local_120,(AssertionResult *)"released != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4b2,(char *)CONCAT71(local_108._1_7_,local_108[0]));
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._1_7_,local_108[0]) != &local_f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._1_7_,local_108[0]),local_f8._M_allocated_capacity + 1);
    }
    if (local_128._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_128._M_head_impl + 8))();
    }
    if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_118,local_118);
    }
  }
  local_120._M_head_impl = pbVar2;
  testing::internal::CmpHelperEQ<google::protobuf::Message_const*,google::protobuf::Message*>
            ((internal *)local_108,"&sub_message","released",(Message **)&local_120,&local_e8);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4b4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  if (local_e8 != (Message *)0x0) {
    (*(local_e8->super_MessageLite)._vptr_MessageLite[1])();
  }
  TestUtil::ReflectionTester::SetOneofViaReflection(&local_a0.super_Message);
  name_03._M_str = "foo_message";
  name_03._M_len = 0xb;
  pFVar1 = Descriptor::FindFieldByName(this_00,name_03);
  Reflection::MutableMessage(this_01,&local_a0.super_Message,pFVar1,(MessageFactory *)0x0);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            (&local_a0.super_Message,&local_e0.super_Message);
  name_04._M_str = "foo_message";
  name_04._M_len = 0xb;
  pFVar1 = Descriptor::FindFieldByName(this_00,name_04);
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Reflection::GetMessage(this_01,&local_e0.super_Message,pFVar1,(MessageFactory *)0x0);
  name_05._M_str = "foo_message";
  name_05._M_len = 0xb;
  pFVar1 = Descriptor::FindFieldByName(this_00,name_05);
  local_e8 = Reflection::ReleaseMessage
                       (this_01,&local_e0.super_Message,pFVar1,(MessageFactory *)0x0);
  local_120._M_head_impl._0_1_ = (internal)(local_e8 != (Message *)0x0);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_e8 == (Message *)0x0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)&local_120,(AssertionResult *)"released != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4c6,(char *)CONCAT71(local_108._1_7_,local_108[0]));
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_108._1_7_,local_108[0]) != &local_f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_108._1_7_,local_108[0]),local_f8._M_allocated_capacity + 1);
    }
    if (local_128._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_128._M_head_impl + 8))();
    }
    if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_118,local_118);
    }
  }
  local_120._M_head_impl = pbVar2;
  testing::internal::CmpHelperEQ<google::protobuf::Message_const*,google::protobuf::Message*>
            ((internal *)local_108,"&sub_message2","released",(Message **)&local_120,&local_e8);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_100->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4c8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  if (local_e8 != (Message *)0x0) {
    (*(local_e8->super_MessageLite)._vptr_MessageLite[1])();
  }
  proto2_unittest::TestOneof2::~TestOneof2(&local_e0);
  proto2_unittest::TestOneof2::~TestOneof2(&local_a0);
  proto2_unittest::TestOneof2::~TestOneof2(&local_60);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, SetAllocatedOneofMessageTest) {
  unittest::TestOneof2 from_message1;
  unittest::TestOneof2 from_message2;
  unittest::TestOneof2 to_message;
  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = to_message.GetReflection();

  Message* released = reflection->ReleaseMessage(
      &to_message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_TRUE(released == nullptr);
  released = reflection->ReleaseMessage(
      &to_message, descriptor->FindFieldByName("foo_message"));
  EXPECT_TRUE(released == nullptr);

  TestUtil::ReflectionTester::SetOneofViaReflection(&from_message1);
  TestUtil::ReflectionTester::ExpectOneofSetViaReflection(from_message1);

  TestUtil::ReflectionTester::
      SetAllocatedOptionalMessageFieldsToMessageViaReflection(&from_message1,
                                                              &to_message);
  const Message& sub_message = reflection->GetMessage(
      to_message, descriptor->FindFieldByName("foo_lazy_message"));
  (void)sub_message;  // unused in somce configurations
  released = reflection->ReleaseMessage(
      &to_message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_TRUE(released != nullptr);
  if (!internal::DebugHardenForceCopyInRelease()) {
    EXPECT_EQ(&sub_message, released);
  }
  delete released;

  TestUtil::ReflectionTester::SetOneofViaReflection(&from_message2);

  reflection->MutableMessage(&from_message2,
                             descriptor->FindFieldByName("foo_message"));

  TestUtil::ReflectionTester::
      SetAllocatedOptionalMessageFieldsToMessageViaReflection(&from_message2,
                                                              &to_message);

  const Message& sub_message2 = reflection->GetMessage(
      to_message, descriptor->FindFieldByName("foo_message"));
  (void)sub_message2;  // unused in somce configurations
  released = reflection->ReleaseMessage(
      &to_message, descriptor->FindFieldByName("foo_message"));
  EXPECT_TRUE(released != nullptr);
  if (!internal::DebugHardenForceCopyInRelease()) {
    EXPECT_EQ(&sub_message2, released);
  }
  delete released;
}